

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O3

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
          (SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *this,DWARFDie *V)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar6;
  uint uVar7;
  pair<llvm::NoneType,_bool> pVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<std::_Rb_tree_iterator<llvm::DWARFDie>,_bool> pVar12;
  undefined8 uVar5;
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *pSVar8;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar2 = (this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
            super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
            super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
    uVar3 = (ulong)uVar2;
    if (uVar3 != 0) {
      lVar6 = 0;
      pSVar8 = this;
      do {
        piVar1 = (int *)((long)(this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                               super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                               super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.
                               super_SmallVectorBase.BeginX + lVar6);
        auVar10._0_4_ = -(uint)(*piVar1 == *(int *)&V->U);
        auVar10._4_4_ = -(uint)(piVar1[1] == *(int *)((long)&V->U + 4));
        auVar10._8_4_ = -(uint)(piVar1[2] == *(int *)&V->Die);
        auVar10._12_4_ = -(uint)(piVar1[3] == *(int *)((long)&V->Die + 4));
        auVar11._4_4_ = auVar10._0_4_;
        auVar11._0_4_ = auVar10._4_4_;
        auVar11._8_4_ = auVar10._12_4_;
        auVar11._12_4_ = auVar10._8_4_;
        uVar7 = movmskpd((int)pSVar8,auVar11 & auVar10);
        pSVar8 = (SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)(ulong)uVar7;
        if (uVar7 == 3) {
          if (uVar3 << 4 != lVar6) {
            uVar4._0_4_ = None;
            uVar4._4_1_ = false;
            uVar4._5_3_ = 0;
            return (pair<llvm::NoneType,_bool>)uVar4;
          }
          break;
        }
        lVar6 = lVar6 + 0x10;
      } while (uVar3 << 4 != lVar6);
      if (2 < uVar2) {
        do {
          std::
          _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
          ::_M_insert_unique<llvm::DWARFDie_const&>
                    ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                      *)&this->Set,
                     (DWARFDie *)
                     ((long)(this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                            super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                            super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.
                            super_SmallVectorBase.BeginX + (uVar3 & 0xffffffff) * 0x10 + -0x10));
          uVar3 = (ulong)(this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                         super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                         super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase
                         .Size - 1;
          if ((this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
              super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Capacity <
              uVar3) {
            __assert_fail("N <= capacity()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                          ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
          }
          (this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
          super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
          super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size =
               (uint)uVar3;
        } while ((uint)uVar3 != 0);
        std::
        _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
        ::_M_insert_unique<llvm::DWARFDie_const&>
                  ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                    *)&this->Set,V);
        uVar5._0_4_ = None;
        uVar5._4_1_ = true;
        uVar5._5_3_ = 0;
        return (pair<llvm::NoneType,_bool>)uVar5;
      }
    }
    pVar9.first = None;
    pVar9.second = true;
    pVar9._5_3_ = 0;
    SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
              ((SmallVectorTemplateBase<llvm::DWARFDie,_true> *)this,V);
  }
  else {
    pVar12 = std::
             _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
             ::_M_insert_unique<llvm::DWARFDie_const&>
                       ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                         *)&this->Set,V);
    pVar9 = (pair<llvm::NoneType,_bool>)(((ulong)pVar12.second << 0x20) + 1);
  }
  return pVar9;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }